

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  ImDrawCmd *__src;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  long lVar8;
  ImVec4 *pIVar9;
  ImDrawCmd *__dest;
  int iVar10;
  int iVar11;
  void *pvVar12;
  
  lVar8 = (long)(this->_ClipRectStack).Size;
  pIVar9 = (this->_ClipRectStack).Data + lVar8 + -1;
  if (lVar8 == 0) {
    pIVar9 = &this->_Data->ClipRectFullscreen;
  }
  fVar3 = pIVar9->x;
  fVar4 = pIVar9->y;
  fVar5 = pIVar9->z;
  fVar6 = pIVar9->w;
  lVar8 = (long)(this->_TextureIdStack).Size;
  if (lVar8 == 0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = (this->_TextureIdStack).Data[lVar8 + -1];
  }
  if ((fVar3 <= fVar5) && (fVar4 <= fVar6)) {
    uVar1 = (this->IdxBuffer).Size;
    uVar2 = this->_VtxCurrentOffset;
    iVar7 = (this->CmdBuffer).Size;
    if (iVar7 == (this->CmdBuffer).Capacity) {
      if (iVar7 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar7 / 2 + iVar7;
      }
      iVar11 = iVar7 + 1;
      if (iVar7 + 1 < iVar10) {
        iVar11 = iVar10;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
      __src = (this->CmdBuffer).Data;
      if (__src != (ImDrawCmd *)0x0) {
        memcpy(__dest,__src,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar11;
      iVar7 = (this->CmdBuffer).Size;
    }
    else {
      __dest = (this->CmdBuffer).Data;
    }
    __dest[iVar7].ElemCount = 0;
    pIVar9 = &__dest[iVar7].ClipRect;
    pIVar9->x = fVar3;
    pIVar9->y = fVar4;
    pIVar9->z = fVar5;
    pIVar9->w = fVar6;
    __dest[iVar7].TextureId = pvVar12;
    __dest[iVar7].VtxOffset = uVar2;
    __dest[iVar7].IdxOffset = uVar1;
    __dest[iVar7].UserCallback = (ImDrawCallback)0x0;
    (&__dest[iVar7].UserCallback)[1] = (ImDrawCallback)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                ,0x19e,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}